

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportInstallFileGenerator::GenerateImportTargetsConfig
          (cmExportInstallFileGenerator *this,ostream *os,string *config,string *suffix,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *missingTargets)

{
  cmTargetExport *pcVar1;
  TargetType TVar2;
  cmExportSet *pcVar3;
  pointer ppcVar4;
  cmGeneratorTarget *pcVar5;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  importedLocations;
  ImportPropertyMap properties;
  
  pcVar3 = this->IEGen->ExportSet;
  for (ppcVar4 = (pcVar3->TargetExports).
                 super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppcVar4 !=
      (pcVar3->TargetExports).
      super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppcVar4 = ppcVar4 + 1) {
    pcVar1 = *ppcVar4;
    pcVar5 = pcVar1->Target;
    TVar2 = cmGeneratorTarget::GetType(pcVar5);
    if (TVar2 != INTERFACE_LIBRARY) {
      properties._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      properties._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      properties._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &properties._M_t._M_impl.super__Rb_tree_header._M_header;
      properties._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      importedLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      importedLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      importedLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &importedLocations._M_t._M_impl.super__Rb_tree_header._M_header;
      importedLocations._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      importedLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           importedLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      properties._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           properties._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      SetImportLocationProperty
                ((cmExportInstallFileGenerator *)pcVar5,config,suffix,pcVar1->ArchiveGenerator,
                 (ImportPropertyMap *)&properties._M_t,&importedLocations);
      SetImportLocationProperty
                ((cmExportInstallFileGenerator *)pcVar5,config,suffix,pcVar1->LibraryGenerator,
                 (ImportPropertyMap *)&properties._M_t,&importedLocations);
      SetImportLocationProperty
                ((cmExportInstallFileGenerator *)pcVar5,config,suffix,pcVar1->RuntimeGenerator,
                 (ImportPropertyMap *)&properties._M_t,&importedLocations);
      SetImportLocationProperty
                ((cmExportInstallFileGenerator *)pcVar5,config,suffix,pcVar1->ObjectsGenerator,
                 (ImportPropertyMap *)&properties._M_t,&importedLocations);
      SetImportLocationProperty
                ((cmExportInstallFileGenerator *)pcVar5,config,suffix,pcVar1->FrameworkGenerator,
                 (ImportPropertyMap *)&properties._M_t,&importedLocations);
      SetImportLocationProperty
                ((cmExportInstallFileGenerator *)pcVar5,config,suffix,pcVar1->BundleGenerator,
                 (ImportPropertyMap *)&properties._M_t,&importedLocations);
      if (properties._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        pcVar5 = pcVar1->Target;
        cmExportFileGenerator::SetImportDetailProperties
                  (&this->super_cmExportFileGenerator,config,suffix,pcVar5,
                   (ImportPropertyMap *)&properties._M_t,missingTargets);
        cmExportFileGenerator::SetImportLinkInterface
                  (&this->super_cmExportFileGenerator,config,suffix,InstallInterface,pcVar5,
                   (ImportPropertyMap *)&properties._M_t,missingTargets);
        (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[7])
                  (this,os,config,pcVar5,&properties._M_t);
        (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[8])
                  (this,os,pcVar5,&properties._M_t,&importedLocations);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&importedLocations._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&properties._M_t);
    }
    pcVar3 = this->IEGen->ExportSet;
  }
  return;
}

Assistant:

void cmExportInstallFileGenerator::GenerateImportTargetsConfig(
  std::ostream& os, const std::string& config, std::string const& suffix,
  std::vector<std::string>& missingTargets)
{
  // Add each target in the set to the export.
  for (std::vector<cmTargetExport*>::const_iterator tei =
         this->IEGen->GetExportSet()->GetTargetExports()->begin();
       tei != this->IEGen->GetExportSet()->GetTargetExports()->end(); ++tei) {
    // Collect import properties for this target.
    cmTargetExport const* te = *tei;
    if (te->Target->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      continue;
    }

    ImportPropertyMap properties;
    std::set<std::string> importedLocations;

    this->SetImportLocationProperty(config, suffix, te->ArchiveGenerator,
                                    properties, importedLocations);
    this->SetImportLocationProperty(config, suffix, te->LibraryGenerator,
                                    properties, importedLocations);
    this->SetImportLocationProperty(config, suffix, te->RuntimeGenerator,
                                    properties, importedLocations);
    this->SetImportLocationProperty(config, suffix, te->ObjectsGenerator,
                                    properties, importedLocations);
    this->SetImportLocationProperty(config, suffix, te->FrameworkGenerator,
                                    properties, importedLocations);
    this->SetImportLocationProperty(config, suffix, te->BundleGenerator,
                                    properties, importedLocations);

    // If any file location was set for the target add it to the
    // import file.
    if (!properties.empty()) {
      // Get the rest of the target details.
      cmGeneratorTarget* gtgt = te->Target;
      this->SetImportDetailProperties(config, suffix, gtgt, properties,
                                      missingTargets);

      this->SetImportLinkInterface(config, suffix,
                                   cmGeneratorExpression::InstallInterface,
                                   gtgt, properties, missingTargets);

      // TOOD: PUBLIC_HEADER_LOCATION
      // This should wait until the build feature propagation stuff
      // is done.  Then this can be a propagated include directory.
      // this->GenerateImportProperty(config, te->HeaderGenerator,
      //                              properties);

      // Generate code in the export file.
      this->GenerateImportPropertyCode(os, config, gtgt, properties);
      this->GenerateImportedFileChecksCode(os, gtgt, properties,
                                           importedLocations);
    }
  }
}